

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.hpp
# Opt level: O0

void __thiscall tcu::Exception::~Exception(Exception *this)

{
  Exception *this_local;
  
  *(undefined ***)this = &PTR__Exception_03228770;
  std::__cxx11::string::~string((string *)&this->m_message);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

virtual				~Exception			(void) throw() {}